

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O0

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  sunrealtype *psVar6;
  double dVar7;
  SUNContext ctx;
  sunindextype Nnew;
  sunrealtype *xnew;
  sunrealtype newdt;
  sunrealtype olddt;
  sunrealtype t;
  FILE *UFID;
  FILE *XFID;
  void *arkode_mem;
  SUNLinearSolver LS;
  N_Vector yt;
  N_Vector y2;
  N_Vector y;
  int flag;
  int iout;
  long nli_tot;
  long nli;
  long nni_tot;
  long nni;
  sunindextype i;
  sunrealtype k;
  sunrealtype refine;
  sunindextype N;
  sunrealtype *data;
  UserData udata;
  sunrealtype hscale;
  sunrealtype atol;
  sunrealtype rtol;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  N_Vector in_stack_fffffffffffffee8;
  sunrealtype *xnew_00;
  sunindextype in_stack_ffffffffffffff10;
  UserData in_stack_ffffffffffffff18;
  sunindextype *Nnew_00;
  N_Vector ynew;
  N_Vector y_00;
  sunrealtype *local_d0;
  double local_c8;
  FILE *local_c0;
  FILE *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  int local_88;
  uint local_84;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  double local_18;
  double local_10;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = 1.0;
  local_20 = 0x3f50624dd2f1a9fc;
  local_28 = 0x3ddb7cdfd9d7bdbb;
  local_30 = 0x3ff0000000000000;
  local_38 = (ulong *)0x0;
  local_48 = 0x15;
  local_50 = 0x3f689374bc6a7efa;
  local_58 = 0x3fe0000000000000;
  local_70 = 0;
  local_80 = 0;
  local_84 = 0;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_a8 = 0;
  local_b0 = 0;
  Nnew_00 = (sunindextype *)0x0;
  local_88 = SUNContext_Create(0,&stack0xffffffffffffff10);
  iVar4 = check_flag(in_stack_fffffffffffffee8,
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc);
  if (iVar4 == 0) {
    local_38 = (ulong *)malloc(0x20);
    *local_38 = local_48;
    local_38[2] = local_58;
    local_38[3] = local_50;
    pvVar5 = malloc(local_48 << 3);
    local_38[1] = (ulong)pvVar5;
    for (local_60 = 0; local_60 < (long)local_48; local_60 = local_60 + 1) {
      *(double *)(local_38[1] + local_60 * 8) =
           ((double)local_60 * 1.0) / (double)(long)(local_48 - 1);
    }
    printf("\n1D adaptive Heat PDE test problem:\n");
    printf("  diffusion coefficient:  k = %g\n",local_38[2]);
    printf("  initial N = %li\n",*local_38);
    local_90 = N_VNew_Serial(local_48,in_stack_ffffffffffffff10);
    iVar4 = check_flag(in_stack_fffffffffffffee8,
                       (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc);
    if (iVar4 == 0) {
      N_VConst(0,local_90);
      local_b8 = fopen("heat_mesh.txt","w");
      for (local_60 = 0; local_60 < (long)*local_38; local_60 = local_60 + 1) {
        fprintf(local_b8," %.16e",*(undefined8 *)(local_38[1] + local_60 * 8));
      }
      fprintf(local_b8,"\n");
      local_c0 = fopen("heat1D.txt","w");
      local_40 = N_VGetArrayPointer(local_90);
      for (local_60 = 0; local_60 < (long)*local_38; local_60 = local_60 + 1) {
        fprintf(local_c0," %.16e",*(undefined8 *)(local_40 + local_60 * 8));
      }
      fprintf(local_c0,"\n");
      local_b0 = ARKStepCreate(local_10,0,f,local_90,in_stack_ffffffffffffff10);
      iVar4 = check_flag(in_stack_fffffffffffffee8,
                         (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
      if (iVar4 == 0) {
        local_88 = ARKodeSetUserData(local_b0,local_38);
        iVar4 = check_flag(in_stack_fffffffffffffee8,
                           (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        if (iVar4 == 0) {
          local_88 = ARKodeSetMaxNumSteps(local_b0,10000);
          iVar4 = check_flag(in_stack_fffffffffffffee8,
                             (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffedc);
          if (iVar4 == 0) {
            local_88 = ARKodeSStolerances(local_20,local_28,local_b0);
            iVar4 = check_flag(in_stack_fffffffffffffee8,
                               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                               ,in_stack_fffffffffffffedc);
            if (iVar4 == 0) {
              local_88 = ARKStepSetAdaptivityMethod(local_b0,2,1,0,0);
              iVar4 = check_flag(in_stack_fffffffffffffee8,
                                 (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0),
                                 in_stack_fffffffffffffedc);
              if (iVar4 == 0) {
                local_88 = ARKodeSetPredictorMethod(local_b0,0);
                iVar4 = check_flag(in_stack_fffffffffffffee8,
                                   (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0),
                                   in_stack_fffffffffffffedc);
                if (iVar4 == 0) {
                  local_88 = ARKodeSetLinear(local_b0,1);
                  iVar4 = check_flag(in_stack_fffffffffffffee8,
                                     (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                      in_stack_fffffffffffffee0),
                                     in_stack_fffffffffffffedc);
                  if (iVar4 == 0) {
                    local_a8 = SUNLinSol_PCG(local_90,0,local_48 & 0xffffffff,
                                             in_stack_ffffffffffffff10);
                    iVar4 = check_flag(in_stack_fffffffffffffee8,
                                       (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                        in_stack_fffffffffffffee0),
                                       in_stack_fffffffffffffedc);
                    if (iVar4 == 0) {
                      local_88 = ARKodeSetLinearSolver(local_b0,local_a8,0);
                      iVar4 = check_flag(in_stack_fffffffffffffee8,
                                         (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                          in_stack_fffffffffffffee0),
                                         in_stack_fffffffffffffedc);
                      if (iVar4 == 0) {
                        local_88 = ARKodeSetJacTimes(local_b0,0,Jac);
                        iVar4 = check_flag(in_stack_fffffffffffffee8,
                                           (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                            in_stack_fffffffffffffee0),
                                           in_stack_fffffffffffffedc);
                        if (iVar4 == 0) {
                          local_c8 = local_10;
                          local_d0 = (sunrealtype *)0x0;
                          ynew = (N_Vector)0x0;
                          printf(
                                "  iout          dt_old                 dt_new               ||u||_rms       N   NNI  NLI\n"
                                );
                          printf(
                                " ----------------------------------------------------------------------------------------\n"
                                );
                          uVar3 = local_84;
                          xnew_00 = local_d0;
                          y_00 = ynew;
                          dVar7 = (double)N_VDotProd(local_90,local_90);
                          dVar7 = sqrt(dVar7 / (double)(long)*local_38);
                          printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2i  %3i\n",xnew_00,ynew,
                                 SUB84(dVar7,0),(ulong)uVar3,*local_38,0);
                          do {
                            if (local_18 <= local_c8) {
                              printf(
                                    " ----------------------------------------------------------------------------------------\n"
                                    );
                              printf(" Final solver statistics:\n");
                              printf("   Total number of time steps = %i\n",(ulong)local_84);
                              printf("   Total nonlinear iterations = %li\n",local_70);
                              printf("   Total linear iterations    = %li\n\n",local_80);
                              fclose(local_c0);
                              fclose(local_b8);
                              N_VDestroy(local_90);
                              free((void *)local_38[1]);
                              free(local_38);
                              ARKodeFree(&local_b0);
                              SUNLinSolFree(local_a8);
                              SUNContext_Free(&stack0xffffffffffffff10);
                              return 0;
                            }
                            local_88 = ARKodeSetStopTime(local_18,local_b0);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = ARKodeEvolve(local_18,local_b0,local_90,&local_c8,2);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = ARKodeGetLastStep(local_b0,&local_d0);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = ARKodeGetCurrentStep(local_b0,&stack0xffffffffffffff28);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = ARKodeGetNumNonlinSolvIters(local_b0,&local_68);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = ARKodeGetNumLinIters(local_b0,&local_78);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            in_stack_fffffffffffffee8 = y_00;
                            psVar6 = local_d0;
                            if (iVar4 != 0) {
                              return 1;
                            }
                            in_stack_fffffffffffffee4 = local_84 + 1;
                            y_00 = in_stack_fffffffffffffee8;
                            local_84 = in_stack_fffffffffffffee4;
                            dVar7 = (double)N_VDotProd(local_90,local_90);
                            dVar7 = sqrt(dVar7 / (double)(long)*local_38);
                            printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2li  %3li\n",psVar6,
                                   in_stack_fffffffffffffee8,SUB84(dVar7,0),
                                   (ulong)in_stack_fffffffffffffee4,*local_38,local_68,local_78);
                            local_70 = local_68 + local_70;
                            local_80 = local_78 + local_80;
                            local_40 = N_VGetArrayPointer(local_90);
                            for (local_60 = 0; local_60 < (long)*local_38; local_60 = local_60 + 1)
                            {
                              fprintf(local_c0," %.16e",*(undefined8 *)(local_40 + local_60 * 8));
                            }
                            fprintf(local_c0,"\n");
                            for (local_60 = 0; local_60 < (long)*local_38; local_60 = local_60 + 1)
                            {
                              fprintf(local_b8," %.16e",*(undefined8 *)(local_38[1] + local_60 * 8))
                              ;
                            }
                            fprintf(local_b8,"\n");
                            psVar6 = adapt_mesh(y_00,Nnew_00,in_stack_ffffffffffffff18);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_98 = N_VNew_Serial(in_stack_ffffffffffffff18,
                                                     in_stack_ffffffffffffff10);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = project((sunindextype)y_00,psVar6,
                                               (N_Vector)in_stack_ffffffffffffff18,
                                               in_stack_ffffffffffffff10,xnew_00,ynew);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            N_VDestroy(local_90);
                            free((void *)local_38[1]);
                            uVar2 = local_90;
                            uVar1 = local_98;
                            local_38[1] = (ulong)psVar6;
                            Nnew_00 = (sunindextype *)0x0;
                            *local_38 = (ulong)in_stack_ffffffffffffff18;
                            local_a0 = local_90;
                            local_90 = local_98;
                            local_98 = uVar2;
                            local_88 = ARKodeResize(local_30,local_c8,local_b0,uVar1,0);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            SUNLinSolFree(local_a8);
                            local_a8 = SUNLinSol_PCG(local_90,0,local_48 & 0xffffffff,
                                                     in_stack_ffffffffffffff10);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = ARKodeSetLinearSolver(local_b0,local_a8,0);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                            if (iVar4 != 0) {
                              return 1;
                            }
                            local_88 = ARKodeSetJacTimes(local_b0,0,Jac);
                            iVar4 = check_flag(in_stack_fffffffffffffee8,
                                               (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0),
                                               in_stack_fffffffffffffedc);
                          } while (iVar4 == 0);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype rtol   = SUN_RCONST(1.e-3);  /* relative tolerance */
  sunrealtype atol   = SUN_RCONST(1.e-10); /* absolute tolerance */
  sunrealtype hscale = SUN_RCONST(1.0); /* time step change factor on resizes */
  UserData udata     = NULL;
  sunrealtype* data;
  sunindextype N     = 21;                 /* initial spatial mesh size */
  sunrealtype refine = SUN_RCONST(3.0e-3); /* adaptivity refinement tolerance */
  sunrealtype k      = SUN_RCONST(0.5);    /* heat conductivity */
  sunindextype i;
  long int nni, nni_tot = 0, nli, nli_tot = 0;
  int iout = 0;

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  N_Vector y2        = NULL; /* empty vector for storing solution */
  N_Vector yt        = NULL; /* empty vector for swapping */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE *XFID, *UFID;
  sunrealtype t, olddt, newdt;
  sunrealtype* xnew = NULL;
  sunindextype Nnew;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate and fill initial udata structure */
  udata             = (UserData)malloc(sizeof(*udata));
  udata->N          = N;
  udata->k          = k;
  udata->refine_tol = refine;
  udata->x          = malloc(N * sizeof(sunrealtype));
  for (i = 0; i < N; i++) { udata->x[i] = ONE * i / (N - 1); }

  /* Initial problem output */
  printf("\n1D adaptive Heat PDE test problem:\n");
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);
  printf("  initial N = %li\n", (long int)udata->N);

  /* Initialize data structures */
  y = N_VNew_Serial(N, ctx); /* Create initial serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(ZERO, y); /* Set initial conditions */

  /* output mesh to disk */
  XFID = fopen("heat_mesh.txt", "w");

  /* output initial mesh to disk */
  for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
  fprintf(XFID, "\n");

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");

  /* output initial condition to disk */
  data = N_VGetArrayPointer(y);
  for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
  fprintf(UFID, "\n");

  /* Initialize the ARK timestepper */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)udata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 10000); /* Increase max num steps  */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, rtol, atol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }
  flag = ARKStepSetAdaptivityMethod(arkode_mem, 2, 1, 0,
                                    NULL); /* Set adaptivity method */
  if (check_flag(&flag, "ARKodeSetAdaptivityMethod", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem, 0); /* Set predictor method */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }

  /* Specify linearly implicit RHS, with time-dependent Jacobian */
  flag = ARKodeSetLinear(arkode_mem, 1);
  if (check_flag(&flag, "ARKodeSetLinear", 1)) { return 1; }

  /* Initialize PCG solver -- no preconditioning, with up to N iterations  */
  LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
  if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }

  /* Linear solver interface -- set user-supplied J*v routine (no 'jtsetup' required) */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               NULL); /* Attach linear solver to ARKODE */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  olddt = ZERO;
  newdt = ZERO;
  printf("  iout          dt_old                 dt_new               "
         "||u||_rms       N   NNI  NLI\n");
  printf(" --------------------------------------------------------------------"
         "--------------------\n");
  printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2i  %3i\n",
         iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
         (long int)udata->N, 0, 0);
  while (t < Tf)
  {
    /* "set" routines */
    flag = ARKodeSetStopTime(arkode_mem, Tf);
    if (check_flag(&flag, "ARKodeSetStopTime", 1)) { return 1; }

    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, Tf, y, &t, ARK_ONE_STEP);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

    /* "get" routines */
    flag = ARKodeGetLastStep(arkode_mem, &olddt);
    if (check_flag(&flag, "ARKodeGetLastStep", 1)) { return 1; }
    flag = ARKodeGetCurrentStep(arkode_mem, &newdt);
    if (check_flag(&flag, "ARKodeGetCurrentStep", 1)) { return 1; }
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    if (check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1)) { return 1; }
    flag = ARKodeGetNumLinIters(arkode_mem, &nli);
    if (check_flag(&flag, "ARKodeGetNumLinIters", 1)) { return 1; }

    /* print current solution stats */
    iout++;
    printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2li  %3li\n",
           iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
           (long int)udata->N, nni, nli);
    nni_tot += nni;
    nli_tot += nli;

    /* output results and current mesh to disk */
    data = N_VGetArrayPointer(y);
    for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
    fprintf(UFID, "\n");
    for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
    fprintf(XFID, "\n");

    /* adapt the spatial mesh */
    xnew = adapt_mesh(y, &Nnew, udata);
    if (check_flag(xnew, "ark_adapt", 0)) { return 1; }

    /* create N_Vector of new length */
    y2 = N_VNew_Serial(Nnew, ctx);
    if (check_flag((void*)y2, "N_VNew_Serial", 0)) { return 1; }

    /* project solution onto new mesh */
    flag = project(udata->N, udata->x, y, Nnew, xnew, y2);
    if (check_flag(&flag, "project", 1)) { return 1; }

    /* delete old vector, old mesh */
    N_VDestroy(y);
    free(udata->x);

    /* swap x and xnew so that new mesh is stored in udata structure */
    udata->x = xnew;
    xnew     = NULL;
    udata->N = Nnew; /* store size of new mesh */

    /* swap y and y2 so that y holds new solution */
    yt = y;
    y  = y2;
    y2 = yt;

    /* call ARKodeResize to notify integrator of change in mesh */
    flag = ARKodeResize(arkode_mem, y, hscale, t, NULL, NULL);
    if (check_flag(&flag, "ARKodeResize", 1)) { return 1; }

    /* destroy and re-allocate linear solver memory; reattach to ARKODE interface */
    SUNLinSolFree(LS);
    LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
    if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }
    flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL);
    if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
    flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac);
    if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }
  }
  printf(" --------------------------------------------------------------------"
         "--------------------\n");

  /* print some final statistics */
  printf(" Final solver statistics:\n");
  printf("   Total number of time steps = %i\n", iout);
  printf("   Total nonlinear iterations = %li\n", nni_tot);
  printf("   Total linear iterations    = %li\n\n", nli_tot);

  /* Clean up and return with successful completion */
  fclose(UFID);
  fclose(XFID);
  N_VDestroy(y);  /* Free vectors */
  free(udata->x); /* Free user data */
  free(udata);
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}